

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O1

void picosha2::detail::hash256_block<unsigned_long*,unsigned_char*>
               (unsigned_long *message_digest,uchar *first,uchar *last)

{
  unsigned_long uVar1;
  ulong uVar2;
  size_t i_1;
  unsigned_long uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  size_t i;
  long lVar14;
  ulong uVar15;
  word_t w [64];
  int aiStack_2b8 [2];
  ulong auStack_2b0 [4];
  undefined8 uStack_290;
  int local_270 [14];
  ulong local_238 [9];
  int aiStack_1f0 [10];
  ulong auStack_1c8 [51];
  
  if (first + 0x40 == last) {
    lVar14 = 0;
    uStack_290 = 0x1039ba;
    memset(local_238,0,0x200);
    do {
      uVar4 = *(uint *)(first + lVar14 * 4);
      local_238[lVar14] =
           (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x10);
    lVar14 = 0x10;
    do {
      uVar6 = local_238[lVar14 + -2];
      uVar12 = auStack_2b0[lVar14];
      local_238[lVar14] =
           (ulong)(aiStack_2b8[lVar14 * 2] + local_270[lVar14 * 2] +
                   ((uint)(uVar6 >> 10) ^ ((uint)(uVar6 >> 0x13) | (int)uVar6 << 0xd) ^
                   ((uint)(uVar6 >> 0x11) | (int)uVar6 << 0xf)) +
                  ((uint)(uVar12 >> 3) ^ ((uint)(uVar12 >> 0x12) | (int)uVar12 << 0xe) ^
                  ((uint)(uVar12 >> 7) | (int)uVar12 << 0x19)));
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x40);
    lVar14 = 0;
    uVar1 = message_digest[1];
    uVar6 = message_digest[4];
    uVar3 = message_digest[2];
    uVar9 = *message_digest;
    uVar10 = message_digest[3];
    uVar12 = message_digest[7];
    uVar2 = message_digest[6];
    uVar5 = message_digest[5];
    do {
      uVar15 = uVar5;
      uVar13 = uVar2;
      uVar8 = uVar9;
      uVar7 = uVar3;
      uVar5 = uVar6;
      uVar3 = uVar1;
      uVar4 = (uint)uVar5;
      iVar11 = (int)uVar12 + ((uint)uVar15 & uVar4) + (~uVar4 & (uint)uVar13) +
               (((uint)(uVar5 >> 0x19) | uVar4 << 7) ^
               ((uint)(uVar5 >> 0xb) | uVar4 << 0x15) ^ ((uint)(uVar5 >> 6) | uVar4 << 0x1a)) +
               *(int *)((long)&add_constant + lVar14) + *(int *)((long)local_238 + lVar14);
      uVar4 = (uint)uVar8;
      uVar6 = (ulong)(uint)((int)uVar10 + iVar11);
      uVar9 = (unsigned_long)
              (((uint)uVar7 & (uint)uVar3 ^ ((uint)uVar7 ^ (uint)uVar3) & uVar4) +
               (((uint)(uVar8 >> 0x16) | uVar4 << 10) ^
               ((uint)(uVar8 >> 0xd) | uVar4 << 0x13) ^ ((uint)(uVar8 >> 2) | uVar4 << 0x1e)) +
              iVar11);
      lVar14 = lVar14 + 8;
      uVar1 = uVar8;
      uVar10 = uVar7;
      uVar12 = uVar13;
      uVar2 = uVar15;
    } while (lVar14 != 0x200);
    *message_digest = uVar9 + *message_digest;
    message_digest[1] = uVar8 + message_digest[1];
    message_digest[2] = uVar3 + message_digest[2];
    message_digest[3] = uVar7 + message_digest[3];
    message_digest[4] = uVar6 + message_digest[4];
    message_digest[5] = uVar5 + message_digest[5];
    message_digest[6] = uVar15 + message_digest[6];
    message_digest[7] = uVar13 + message_digest[7];
    lVar14 = 0;
    do {
      *(undefined4 *)((long)message_digest + lVar14 * 8 + 4) = 0;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 8);
    return;
  }
  uStack_290 = 0x103bf1;
  __assert_fail("first + 64 == last",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/simontime[P]devicecert-validator/picosha2.h"
                ,0x5d,
                "void picosha2::detail::hash256_block(RaIter1, RaIter2, RaIter2) [RaIter1 = unsigned long *, RaIter2 = unsigned char *]"
               );
}

Assistant:

void hash256_block(RaIter1 message_digest, RaIter2 first, RaIter2 last) {
    assert(first + 64 == last);
    static_cast<void>(last);  // for avoiding unused-variable warning
    word_t w[64];
    std::fill(w, w + 64, 0);
    for (std::size_t i = 0; i < 16; ++i) {
        w[i] = (static_cast<word_t>(mask_8bit(*(first + i * 4))) << 24) |
               (static_cast<word_t>(mask_8bit(*(first + i * 4 + 1))) << 16) |
               (static_cast<word_t>(mask_8bit(*(first + i * 4 + 2))) << 8) |
               (static_cast<word_t>(mask_8bit(*(first + i * 4 + 3))));
    }
    for (std::size_t i = 16; i < 64; ++i) {
        w[i] = mask_32bit(ssig1(w[i - 2]) + w[i - 7] + ssig0(w[i - 15]) +
                          w[i - 16]);
    }

    word_t a = *message_digest;
    word_t b = *(message_digest + 1);
    word_t c = *(message_digest + 2);
    word_t d = *(message_digest + 3);
    word_t e = *(message_digest + 4);
    word_t f = *(message_digest + 5);
    word_t g = *(message_digest + 6);
    word_t h = *(message_digest + 7);

    for (std::size_t i = 0; i < 64; ++i) {
        word_t temp1 = h + bsig1(e) + ch(e, f, g) + add_constant[i] + w[i];
        word_t temp2 = bsig0(a) + maj(a, b, c);
        h = g;
        g = f;
        f = e;
        e = mask_32bit(d + temp1);
        d = c;
        c = b;
        b = a;
        a = mask_32bit(temp1 + temp2);
    }
    *message_digest += a;
    *(message_digest + 1) += b;
    *(message_digest + 2) += c;
    *(message_digest + 3) += d;
    *(message_digest + 4) += e;
    *(message_digest + 5) += f;
    *(message_digest + 6) += g;
    *(message_digest + 7) += h;
    for (std::size_t i = 0; i < 8; ++i) {
        *(message_digest + i) = mask_32bit(*(message_digest + i));
    }
}